

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::~SchemaLoader(SchemaLoader *this)

{
  if ((this->impl).value.ptr != (Impl *)0x0) {
    (this->impl).value.ptr = (Impl *)0x0;
    (**((this->impl).value.disposer)->_vptr_Disposer)();
  }
  kj::_::Mutex::~Mutex((Mutex *)this);
  return;
}

Assistant:

SchemaLoader::~SchemaLoader() noexcept(false) {}